

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O2

void __thiscall wallet::CKeyMetadata::SetNull(CKeyMetadata *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->nVersion = 0xc;
  this->nCreateTime = 0;
  (this->hdKeypath)._M_string_length = 0;
  *(this->hdKeypath)._M_dataplus._M_p = '\0';
  base_blob<160U>::SetNull((base_blob<160U> *)&this->hd_seed_id);
  KeyOriginInfo::clear(&this->key_origin);
  this->has_key_origin = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetNull()
    {
        nVersion = CKeyMetadata::CURRENT_VERSION;
        nCreateTime = 0;
        hdKeypath.clear();
        hd_seed_id.SetNull();
        key_origin.clear();
        has_key_origin = false;
    }